

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

int16 get16bits11signed(int base,int table,int mul,int index)

{
  int iVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar5 = index + 3;
  if (-1 < index) {
    uVar5 = index;
  }
  uVar7 = -alphaBase[table][((uVar5 & 0xfffffffc) - index) + 3];
  if ((index & 0xfffffffcU) == 4) {
    uVar7 = ~alphaBase[table][((uVar5 & 0xfffffffc) - index) + 3];
  }
  iVar6 = 1;
  if (mul != 0) {
    iVar6 = mul * 8;
  }
  iVar1 = -(iVar6 * uVar7);
  if ((index & 0xfffffffcU) == 4) {
    iVar1 = iVar6 * uVar7;
  }
  iVar6 = -0x3f8;
  if (base != 0) {
    iVar6 = base * 8 + -0x400;
  }
  uVar7 = iVar6 + iVar1;
  uVar5 = 0xfffffc01;
  if (-0x3ff < (int)uVar7) {
    uVar5 = uVar7;
  }
  if (0x3fe < (int)uVar5) {
    uVar5 = 0x3ff;
  }
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  sVar3 = (short)(uVar2 >> 5) + (short)uVar2 * 0x20;
  sVar4 = -sVar3;
  if (-1 < (int)uVar7) {
    sVar4 = sVar3;
  }
  return sVar4;
}

Assistant:

int16 get16bits11signed(int base, int table, int mul, int index) 
{
	int elevenbase = base-128;
	if(elevenbase==-128)
		elevenbase=-127;
	elevenbase*=8;
	//i want the positive value here
	int tabVal = -alphaBase[table][3-index%4]-1;
	//and the sign, please
	int sign = 1-(index/4);
	
	if(sign)
		tabVal=tabVal+1;
	int elevenTabVal = tabVal*8;

	if(mul!=0)
		elevenTabVal*=mul;
	else
		elevenTabVal/=8;

	if(sign)
		elevenTabVal=-elevenTabVal;

	//calculate sum
	int elevenbits = elevenbase+elevenTabVal;

	//clamp..
	if(elevenbits>=1024)
		elevenbits=1023;
	else if(elevenbits<-1023)
		elevenbits=-1023;
	//this is the value we would actually output.. 
	//but there aren't any good 11-bit file or uncompressed GL formats
	//so we extend to 15 bits signed.
	sign = elevenbits<0;
	elevenbits=abs(elevenbits);
	int16 fifteenbits = (elevenbits<<5)+(elevenbits>>5);
	int16 sixteenbits=fifteenbits;

	if(sign)
		sixteenbits=-sixteenbits;
	
	return sixteenbits;
}